

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddGenetic.c
# Opt level: O1

int find_best(void)

{
  int iVar1;
  int *piVar2;
  long lVar3;
  int iVar4;
  
  iVar4 = 0;
  if (1 < (long)popsize) {
    piVar2 = storedd + (long)numvars * 2 + 1;
    iVar4 = 0;
    lVar3 = 1;
    do {
      iVar1 = (int)lVar3;
      if (storedd[(numvars + 1) * iVar4 + numvars] <= *piVar2) {
        iVar1 = iVar4;
      }
      iVar4 = iVar1;
      lVar3 = lVar3 + 1;
      piVar2 = piVar2 + (long)numvars + 1;
    } while (popsize != lVar3);
  }
  return iVar4;
}

Assistant:

static int
find_best(void)
{
    int i,small;

    small = 0;
    for (i = 1; i < popsize; i++) {
        if (STOREDD(i,numvars) < STOREDD(small,numvars)) {
            small = i;
        }
    }
    return(small);

}